

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_TestMemoryAccountant_countMaximumAllocationsAtATime_TestShell::createTest
          (TEST_TestMemoryAccountant_countMaximumAllocationsAtATime_TestShell *this)

{
  TEST_TestMemoryAccountant_countMaximumAllocationsAtATime_Test *this_00;
  
  this_00 = (TEST_TestMemoryAccountant_countMaximumAllocationsAtATime_Test *)
            operator_new(0x68,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                         ,0x1a3);
  TEST_TestMemoryAccountant_countMaximumAllocationsAtATime_Test::
  TEST_TestMemoryAccountant_countMaximumAllocationsAtATime_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestMemoryAccountant, countMaximumAllocationsAtATime)
{
    accountant.alloc(4);
    accountant.alloc(4);
    accountant.dealloc(4);
    accountant.dealloc(4);
    accountant.alloc(4);
    LONGS_EQUAL(2, accountant.maximumAllocationAtATimeOfSize(4));
}